

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O1

SetInfluences * __thiscall
wasm::LazyLocalGraph::getSetInfluences(LazyLocalGraph *this,LocalSet *set)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __hash_code __code;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->setInfluences)._M_h._M_bucket_count;
  uVar3 = (ulong)set % uVar1;
  p_Var4 = (this->setInfluences)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (LocalSet *)p_Var4->_M_nxt[1]._M_nxt != set)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (LocalSet *)p_Var2[1]._M_nxt == set)) goto LAB_0071c215;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0071c215:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    computeSetInfluences(this,set);
    uVar1 = (this->setInfluences)._M_h._M_bucket_count;
    uVar3 = (ulong)set % uVar1;
    p_Var4 = (this->setInfluences)._M_h._M_buckets[uVar3];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (LocalSet *)p_Var4->_M_nxt[1]._M_nxt != set)) {
      while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
           (p_Var5 = p_Var4, (LocalSet *)p_Var2[1]._M_nxt == set)) goto LAB_0071c291;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_0071c291:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var2 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var2 = p_Var5->_M_nxt;
    }
    if (p_Var2 == (_Hash_node_base *)0x0) {
      __assert_fail("iter != setInfluences.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xcd,
                    "const SetInfluences &wasm::LazyLocalGraph::getSetInfluences(LocalSet *) const")
      ;
    }
  }
  return (SetInfluences *)(p_Var2 + 2);
}

Assistant:

const SetInfluences& getSetInfluences(LocalSet* set) const {
    auto iter = setInfluences.find(set);
    if (iter == setInfluences.end()) {
      computeSetInfluences(set);
      iter = setInfluences.find(set);
      assert(iter != setInfluences.end());
    }
    return iter->second;
  }